

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDimple::DeleteComponents
          (ON_SubDimple *this,uint level_index,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  ushort uVar1;
  ushort uVar2;
  ON_SubDLevel *this_00;
  ON_SubDVertex *pOVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ON_SubDLevel **ppOVar7;
  ulong uVar8;
  ON_SubDFace *pOVar9;
  ON_SubDEdge *pOVar10;
  bool local_124;
  bool local_123;
  bool local_121;
  ON_SubDFace *face_2;
  unsigned_short vfi;
  ON_SubDEdge *edge_4;
  unsigned_short vei;
  uint crease_count;
  bool bInteriorVertex;
  ON_SubDVertex *pOStack_e8;
  uint count;
  ON_SubDVertex *vertex_1;
  ON_SubDFace *face_1;
  unsigned_short efi;
  ON_SubDFacePtr *pOStack_d0;
  unsigned_short edge_face_count;
  ON_SubDFacePtr *fptr1;
  ON_SubDFacePtr *fptr0;
  ON_SubDEdge *edge_3;
  bool bDelete_2;
  ON_SubDVertex *pOStack_b0;
  ON_SubDVertex *vertex;
  ON_SubDVertex *next_vertex;
  unsigned_short evi;
  bool bDelete_1;
  ON_SubDEdge *pOStack_90;
  ON_SubDEdge *edge_2;
  ON_SubDEdge *next_edge;
  ulong uStack_78;
  ON_ComponentStatus allsetcheck;
  ON_SubDEdge *edge_1;
  ON_SubDEdgePtr *pOStack_68;
  unsigned_short fei_1;
  ON_SubDEdgePtr *eptr_1;
  ON_SubDEdge *edge;
  ON_SubDEdgePtr *pOStack_50;
  unsigned_short fei;
  ON_SubDEdgePtr *eptr;
  ON_SubDFace *pOStack_40;
  bool bDelete;
  ON_SubDFace *face;
  ON_SubDFace *next_face;
  ON_SubDLevel *level;
  uint deleted_component_count;
  bool bMarkDeletedFaceEdges_local;
  bool bUpdateTagsAndCoefficients_local;
  bool bDeleteIsolatedEdges_local;
  uint level_index_local;
  ON_SubDimple *this_local;
  
  level._4_4_ = 0;
  uVar6 = ON_SimpleArray<ON_SubDLevel_*>::UnsignedCount(&this->m_levels);
  if (level_index < uVar6) {
    ppOVar7 = ON_SimpleArray<ON_SubDLevel_*>::operator[](&this->m_levels,level_index);
    this_00 = *ppOVar7;
    if (this_00 == (ON_SubDLevel *)0x0) {
      ON_SubDIncrementErrorCount();
      this_local._4_4_ = 0;
    }
    else {
      if (bMarkDeletedFaceEdges) {
        ON_SubDLevel::ClearRuntimeMarks(this_00,false,true,false);
      }
      pOVar9 = this_00->m_face[0];
LAB_0089ae9c:
      pOStack_40 = pOVar9;
      if (pOStack_40 != (ON_SubDFace *)0x0) {
        pOVar9 = pOStack_40->m_next_face;
        bVar4 = ON_ComponentStatus::operator==
                          (&ON_ComponentStatus::AllSet,
                           &(pOStack_40->super_ON_SubDComponentBase).m_status);
        local_121 = true;
        if (!bVar4) {
          local_121 = pOStack_40->m_edge_count == 0;
        }
        if (!local_121) goto code_r0x0089af0c;
        goto LAB_0089b085;
      }
      ON_ComponentStatus::ON_ComponentStatus((ON_ComponentStatus *)((long)&next_edge + 6));
      pOVar10 = this_00->m_edge[0];
LAB_0089b17a:
      pOStack_90 = pOVar10;
      if (pOStack_90 != (ON_SubDEdge *)0x0) {
        pOVar10 = pOStack_90->m_next_edge;
        next_edge._6_2_ =
             ON_ComponentStatus::LogicalAnd
                       (ON_ComponentStatus::AllSet,(pOStack_90->super_ON_SubDComponentBase).m_status
                       );
        bVar4 = ON_ComponentStatus::operator==
                          (&ON_ComponentStatus::AllSet,(ON_ComponentStatus *)((long)&next_edge + 6))
        ;
        local_123 = true;
        if (!bVar4) {
          local_124 = false;
          if (bDeleteIsolatedEdges) {
            local_124 = pOStack_90->m_face_count == 0;
          }
          local_123 = local_124;
        }
        if (!local_123) goto code_r0x0089b257;
        goto LAB_0089b33a;
      }
      pOVar3 = this_00->m_vertex[0];
      while (pOStack_b0 = pOVar3, pOStack_b0 != (ON_SubDVertex *)0x0) {
        pOVar3 = pOStack_b0->m_next_vertex;
        next_edge._6_2_ =
             ON_ComponentStatus::LogicalAnd
                       (ON_ComponentStatus::AllSet,(pOStack_b0->super_ON_SubDComponentBase).m_status
                       );
        bVar5 = ON_ComponentStatus::operator==
                          (&ON_ComponentStatus::AllSet,(ON_ComponentStatus *)((long)&next_edge + 6))
        ;
        bVar4 = true;
        if ((!bVar5) && ((!bDeleteIsolatedEdges || (bVar4 = true, pOStack_b0->m_face_count != 0))))
        {
          bVar4 = pOStack_b0->m_edge_count == 0;
        }
        if (bVar4) {
          ON_SubDLevel::RemoveVertex(this_00,pOStack_b0);
          ON_SubDHeap::ReturnVertex(&this->m_heap,pOStack_b0);
          level._4_4_ = level._4_4_ + 1;
        }
      }
      if (level._4_4_ == 0) {
        this_local._4_4_ = 0;
      }
      else {
        pOVar10 = this_00->m_edge[0];
        while (fptr0 = (ON_SubDFacePtr *)pOVar10, fptr0 != (ON_SubDFacePtr *)0x0) {
          pOVar10 = (ON_SubDEdge *)fptr0[0xb].m_ptr;
          fptr1 = fptr0 + 0xd;
          pOStack_d0 = fptr0 + 0xd;
          uVar1 = *(ushort *)((long)&fptr0[0xc].m_ptr + 4);
          *(undefined2 *)((long)&fptr0[0xc].m_ptr + 4) = 0;
          for (face_1._4_2_ = 0; face_1._4_2_ < uVar1; face_1._4_2_ = face_1._4_2_ + 1) {
            if (face_1._4_2_ == 2) {
              fptr1 = (ON_SubDFacePtr *)fptr0[0xf].m_ptr;
            }
            pOVar9 = ON_SubDFacePtr::Face(fptr1);
            if ((pOVar9 != (ON_SubDFace *)0x0) &&
               (uVar6 = ON_SubDComponentBase::ArchiveId(&pOVar9->super_ON_SubDComponentBase),
               uVar6 != 0xffffffff)) {
              pOStack_d0->m_ptr = fptr1->m_ptr;
              *(short *)((long)&fptr0[0xc].m_ptr + 4) = *(short *)((long)&fptr0[0xc].m_ptr + 4) + 1;
              pOStack_d0 = pOStack_d0 + 1;
              if (*(short *)((long)&fptr0[0xc].m_ptr + 4) == 2) {
                pOStack_d0 = (ON_SubDFacePtr *)fptr0[0xf].m_ptr;
              }
            }
            fptr1 = fptr1 + 1;
          }
          if ((*(short *)((long)&fptr0[0xc].m_ptr + 4) == 0) && (bDeleteIsolatedEdges)) {
            ON_SubDLevel::RemoveEdge(this_00,(ON_SubDEdge *)fptr0);
            ON_SubDHeap::ReturnEdge(&this->m_heap,(ON_SubDEdge *)fptr0);
            level._4_4_ = level._4_4_ + 1;
          }
          else {
            if ((*(ushort *)((long)&fptr0[0xc].m_ptr + 4) < 3) && (fptr0[0xf].m_ptr != 0)) {
              ON_SubDHeap::ReturnEdgeExtraArray(&this->m_heap,(ON_SubDEdge *)fptr0);
            }
            if (bUpdateTagsAndCoefficients) {
              if (*(short *)((long)&fptr0[0xc].m_ptr + 4) != 2) {
                *(undefined1 *)&fptr0[0xc].m_ptr = 2;
              }
              fptr0[0x12].m_ptr = (ON__UINT_PTR)-8883.0;
              fptr0[0x13].m_ptr = (ON__UINT_PTR)-8883.0;
            }
          }
        }
        pOVar3 = this_00->m_vertex[0];
        while (pOStack_e8 = pOVar3, pOStack_e8 != (ON_SubDVertex *)0x0) {
          pOVar3 = pOStack_e8->m_next_vertex;
          uVar1 = pOStack_e8->m_edge_count;
          pOStack_e8->m_edge_count = 0;
          bVar4 = true;
          edge_4._4_4_ = 0;
          for (edge_4._2_2_ = 0; edge_4._2_2_ < uVar1; edge_4._2_2_ = edge_4._2_2_ + 1) {
            pOVar10 = (ON_SubDEdge *)(pOStack_e8->m_edges[edge_4._2_2_].m_ptr & 0xfffffffffffffff8);
            if ((pOVar10 == (ON_SubDEdge *)0x0) ||
               (uVar6 = ON_SubDComponentBase::ArchiveId((ON_SubDComponentBase *)pOVar10),
               uVar6 == 0xffffffff)) {
              bVar4 = false;
            }
            else {
              bVar5 = ON_SubDEdge::IsCrease(pOVar10);
              if (bVar5) {
                edge_4._4_4_ = edge_4._4_4_ + 1;
              }
              if (pOVar10->m_face_count != 2) {
                bVar4 = false;
              }
              uVar2 = pOStack_e8->m_edge_count;
              pOStack_e8->m_edge_count = uVar2 + 1;
              pOStack_e8->m_edges[uVar2].m_ptr = pOStack_e8->m_edges[edge_4._2_2_].m_ptr;
            }
          }
          uVar1 = pOStack_e8->m_face_count;
          pOStack_e8->m_face_count = 0;
          for (face_2._6_2_ = 0; face_2._6_2_ < uVar1; face_2._6_2_ = face_2._6_2_ + 1) {
            if ((pOStack_e8->m_faces[face_2._6_2_] != (ON_SubDFace *)0x0) &&
               (uVar6 = ON_SubDComponentBase::ArchiveId
                                  (&pOStack_e8->m_faces[face_2._6_2_]->super_ON_SubDComponentBase),
               uVar6 != 0xffffffff)) {
              pOVar9 = pOStack_e8->m_faces[face_2._6_2_];
              uVar2 = pOStack_e8->m_face_count;
              pOStack_e8->m_face_count = uVar2 + 1;
              pOStack_e8->m_faces[uVar2] = pOVar9;
            }
          }
          if ((pOStack_e8->m_face_count == 0) && (pOStack_e8->m_edge_count == 0)) {
            ON_SubDLevel::RemoveVertex(this_00,pOStack_e8);
            ON_SubDHeap::ReturnVertex(&this->m_heap,pOStack_e8);
            level._4_4_ = level._4_4_ + 1;
          }
          else if ((edge_4._4_4_ == 1) &&
                  ((pOStack_e8->m_edge_count == 1 && (pOStack_e8->m_face_count == 0)))) {
            pOStack_e8->m_vertex_tag = Corner;
          }
          else if (edge_4._4_4_ < 3) {
            if (((!bVar4) || (1 < edge_4._4_4_)) &&
               (bVar4 = ON_SubDVertex::IsCreaseOrCorner(pOStack_e8), !bVar4)) {
              pOStack_e8->m_vertex_tag = Crease;
            }
          }
          else {
            pOStack_e8->m_vertex_tag = Corner;
          }
        }
        if (((this_00->m_vertex_count == 0) || (this_00->m_edge_count == 0)) ||
           ((bDeleteIsolatedEdges && (this_00->m_face_count == 0)))) {
          Destroy(this);
        }
        else {
          ON_SubDLevel::MarkAggregateComponentStatusAsNotCurrent(this_00);
          ON_SubDLevel::ClearEvaluationCache(this_00);
          ClearHigherSubdivisionLevels(this,level_index);
          if (bUpdateTagsAndCoefficients) {
            ON_SubDLevel::UpdateAllTagsAndSectorCoefficients(this_00,false);
          }
        }
        ChangeGeometryContentSerialNumber(this,false);
        this_local._4_4_ = level._4_4_;
      }
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
code_r0x0089af0c:
  pOStack_50 = pOStack_40->m_edge4;
  edge._6_2_ = 0;
  while ((edge._6_2_ < pOStack_40->m_edge_count && !local_121 &&
         ((edge._6_2_ != 4 ||
          (pOStack_50 = pOStack_40->m_edgex, pOStack_50 != (ON_SubDEdgePtr *)0x0))))) {
    uVar8 = pOStack_50->m_ptr & 0xfffffffffffffff8;
    if (((((uVar8 == 0) || (*(long *)(uVar8 + 0x80) == 0)) || (*(long *)(uVar8 + 0x88) == 0)) ||
        (((bVar4 = ON_ComponentStatus::operator==
                             (&ON_ComponentStatus::AllSet,(ON_ComponentStatus *)(uVar8 + 0x10)),
          bVar4 || (bVar4 = ON_ComponentStatus::operator==
                                      (&ON_ComponentStatus::AllSet,
                                       (ON_ComponentStatus *)(*(long *)(uVar8 + 0x80) + 0x10)),
                   bVar4)) ||
         (bVar4 = ON_ComponentStatus::operator==
                            (&ON_ComponentStatus::AllSet,
                             (ON_ComponentStatus *)(*(long *)(uVar8 + 0x88) + 0x10)), bVar4)))) &&
       ((local_121 = true, uVar8 != 0 &&
        (bVar4 = ON_ComponentStatus::operator!=
                           (&ON_ComponentStatus::AllSet,(ON_ComponentStatus *)(uVar8 + 0x10)), bVar4
        )))) {
      *(ON_ComponentStatus *)(uVar8 + 0x10) = ON_ComponentStatus::AllSet;
    }
    edge._6_2_ = edge._6_2_ + 1;
    pOStack_50 = pOStack_50 + 1;
  }
  if (local_121) {
LAB_0089b085:
    if (bMarkDeletedFaceEdges) {
      pOStack_68 = pOStack_40->m_edge4;
      edge_1._6_2_ = 0;
      while ((edge_1._6_2_ < pOStack_40->m_edge_count &&
             ((edge_1._6_2_ != 4 ||
              (pOStack_68 = pOStack_40->m_edgex, pOStack_68 != (ON_SubDEdgePtr *)0x0))))) {
        uStack_78 = pOStack_68->m_ptr & 0xfffffffffffffff8;
        if (uStack_78 != 0) {
          ON_ComponentStatus::SetRuntimeMark((ON_ComponentStatus *)(uStack_78 + 0x10));
        }
        edge_1._6_2_ = edge_1._6_2_ + 1;
        pOStack_68 = pOStack_68 + 1;
      }
    }
    ON_SubDLevel::RemoveFace(this_00,pOStack_40);
    ON_SubDHeap::ReturnFace(&this->m_heap,pOStack_40);
    level._4_4_ = level._4_4_ + 1;
  }
  goto LAB_0089ae9c;
code_r0x0089b257:
  for (next_vertex._6_2_ = 0; next_vertex._6_2_ < 2 && !local_123;
      next_vertex._6_2_ = next_vertex._6_2_ + 1) {
    if ((((pOStack_90->m_vertex[0] == (ON_SubDVertex *)0x0) ||
         (pOStack_90->m_vertex[1] == (ON_SubDVertex *)0x0)) ||
        (bVar4 = ON_ComponentStatus::operator==
                           (&ON_ComponentStatus::AllSet,
                            &(pOStack_90->m_vertex[0]->super_ON_SubDComponentBase).m_status), bVar4)
        ) || (bVar4 = ON_ComponentStatus::operator==
                                (&ON_ComponentStatus::AllSet,
                                 &(pOStack_90->m_vertex[1]->super_ON_SubDComponentBase).m_status),
             bVar4)) {
      local_123 = true;
    }
  }
  if (local_123) {
LAB_0089b33a:
    ON_SubDLevel::RemoveEdge(this_00,pOStack_90);
    ON_SubDHeap::ReturnEdge(&this->m_heap,pOStack_90);
    level._4_4_ = level._4_4_ + 1;
  }
  goto LAB_0089b17a;
}

Assistant:

unsigned int ON_SubDimple::DeleteComponents(
  unsigned int level_index,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
  )
{ 
  unsigned int deleted_component_count = 0;

  if (level_index >= m_levels.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(0);

  ON_SubDLevel* level = m_levels[level_index];
  if (nullptr == level)
    return ON_SUBD_RETURN_ERROR(0);

  if (bMarkDeletedFaceEdges)
    level->ClearRuntimeMarks(false,true,false);

  ON_SubDFace* next_face = level->m_face[0];
  for (ON_SubDFace* face = next_face; nullptr != face; face = next_face)
  {
    next_face = const_cast< ON_SubDFace* >(face->m_next_face);
    bool bDelete = (ON_ComponentStatus::AllSet == face->m_status || 0 == face->m_edge_count);
    if (false == bDelete)
    {
      const ON_SubDEdgePtr* eptr = face->m_edge4;
      for (unsigned short fei = 0; fei < face->m_edge_count && false == bDelete; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = face->m_edgex;
          if (nullptr == eptr)
            break;
        }
        const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr == edge
          || nullptr == edge->m_vertex[0]
          || nullptr == edge->m_vertex[1]
          || ON_ComponentStatus::AllSet == edge->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[0]->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[1]->m_status
          )
        {
          bDelete = true;
          if (nullptr != edge && ON_ComponentStatus::AllSet != edge->m_status)
            edge->m_status = ON_ComponentStatus::AllSet;
        }
      }
      if (false == bDelete)
        continue;
    }

    if (bMarkDeletedFaceEdges)
    {
      // Set runtime mark on face's boundary edges.
      const ON_SubDEdgePtr* eptr = face->m_edge4;
      for (unsigned short fei = 0; fei < face->m_edge_count ; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = face->m_edgex;
          if (nullptr == eptr)
            break;
        }
        const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr != edge)
          edge->m_status.SetRuntimeMark();
      }
    }

    level->RemoveFace(face);
    m_heap.ReturnFace(face);
    deleted_component_count++;
  }

  ON_ComponentStatus allsetcheck;
  ON_SubDEdge* next_edge = level->m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast< ON_SubDEdge* >(edge->m_next_edge);
    allsetcheck = ON_ComponentStatus::LogicalAnd(ON_ComponentStatus::AllSet, edge->m_status);
    bool bDelete = (ON_ComponentStatus::AllSet == allsetcheck || (bDeleteIsolatedEdges && 0 == edge->m_face_count) );
    if (false == bDelete)
    {
      for (unsigned short evi = 0; evi < 2 && false == bDelete; evi++)
      {
        if (nullptr == edge->m_vertex[0]
          || nullptr == edge->m_vertex[1]
          || ON_ComponentStatus::AllSet == edge->m_vertex[0]->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[1]->m_status
          )
          bDelete = true;
      }
      if (false == bDelete)
        continue;
    }

    level->RemoveEdge(edge);
    m_heap.ReturnEdge(edge);
    deleted_component_count++;
  }

  ON_SubDVertex* next_vertex = level->m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);
    allsetcheck = ON_ComponentStatus::LogicalAnd(ON_ComponentStatus::AllSet, vertex->m_status);
    bool bDelete = (ON_ComponentStatus::AllSet == allsetcheck || (bDeleteIsolatedEdges && 0 == vertex->m_face_count) || 0 == vertex->m_edge_count );
    if ( false == bDelete )
      continue;

    level->RemoveVertex(vertex);
    m_heap.ReturnVertex(vertex);
    deleted_component_count++;
  }

  if ( 0 == deleted_component_count )
    return 0;

  // Remove edge references to deleted faces
  next_edge = level->m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast<ON_SubDEdge*>(edge->m_next_edge);
    ON_SubDFacePtr* fptr0 = edge->m_face2;
    ON_SubDFacePtr* fptr1 = edge->m_face2;
    const unsigned short edge_face_count = edge->m_face_count;
    edge->m_face_count = 0;
    for (unsigned short efi = 0; efi < edge_face_count; efi++, fptr0++)
    {
      if (2 == efi)
        fptr0 = edge->m_facex;
      const ON_SubDFace* face = fptr0->Face();
      if (nullptr == face || ON_UNSET_UINT_INDEX == face->ArchiveId())
        continue;
      *fptr1++ = *fptr0;
      edge->m_face_count++;
      if (2 == edge->m_face_count)
        fptr1 = edge->m_facex;
    }

    if (0 == edge->m_face_count && bDeleteIsolatedEdges)
    {
      level->RemoveEdge(edge);
      m_heap.ReturnEdge(edge);
      deleted_component_count++;
      continue;
    }
    
    if (edge->m_face_count <= 2 && nullptr != edge->m_facex)
      m_heap.ReturnEdgeExtraArray(edge);

    if (bUpdateTagsAndCoefficients)
    {
      if (edge->m_face_count != 2)
        edge->m_edge_tag = ON_SubDEdgeTag::Crease;

      edge->m_sector_coefficient[0] = ON_SubDSectorType::UnsetSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::UnsetSectorCoefficient;
    }
  }

  // Remove vertex references to deleted edges and faces
  next_vertex = level->m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);

    unsigned int count = vertex->m_edge_count;
    vertex->m_edge_count = 0;

    bool bInteriorVertex = true;
    unsigned int crease_count = 0;
    for (unsigned short vei = 0; vei < count; vei++)
    {
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(vertex->m_edges[vei].m_ptr);
      if (nullptr == edge || ON_UNSET_UINT_INDEX == edge->ArchiveId())
      {
        bInteriorVertex = false;
        continue;
      }
      if (edge->IsCrease())
        crease_count++;
      if (2 != edge->m_face_count)
        bInteriorVertex = false;
      vertex->m_edges[vertex->m_edge_count++] = vertex->m_edges[vei];
    }


    count = vertex->m_face_count;
    vertex->m_face_count = 0;
    for (unsigned short vfi = 0; vfi < count; vfi++)
    {
      const ON_SubDFace* face = vertex->m_faces[vfi];
      if (nullptr == face || ON_UNSET_UINT_INDEX == face->ArchiveId()) 
        continue;
      vertex->m_faces[vertex->m_face_count++] = vertex->m_faces[vfi];
    }

    if (0 == vertex->m_face_count && 0 == vertex->m_edge_count)
    {
      level->RemoveVertex(vertex);
      m_heap.ReturnVertex(vertex);
      deleted_component_count++;
    }
    else
    {
      if (1 == crease_count && 1 == vertex->m_edge_count && 0 == vertex->m_face_count)
        vertex->m_vertex_tag = ON_SubDVertexTag::Corner;
      else if (crease_count > 2)
        vertex->m_vertex_tag = ON_SubDVertexTag::Corner;
      else if (false == bInteriorVertex || crease_count > 1)
      {
        if (false == vertex->IsCreaseOrCorner())
          vertex->m_vertex_tag = ON_SubDVertexTag::Crease;
      }
    }
  }

  if (0 == level->m_vertex_count || 0 == level->m_edge_count || (bDeleteIsolatedEdges && 0 == level->m_face_count))
  {
    Destroy();
  }
  else
  {
    // remove all information that is no longer valid
    level->MarkAggregateComponentStatusAsNotCurrent();
    level->ClearEvaluationCache();

    ClearHigherSubdivisionLevels(level_index);

    if (bUpdateTagsAndCoefficients)
    {
      // Update vertex tags, edge tags, and sector coefficients.
      level->UpdateAllTagsAndSectorCoefficients(false);
    }
  }

  ChangeGeometryContentSerialNumber(false);

  return deleted_component_count;
}